

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar12;
  byte bVar13;
  BVH *bvh;
  size_t sVar14;
  void *pvVar15;
  long lVar16;
  undefined1 auVar17 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vbool<4> vVar30;
  char cVar31;
  uint uVar32;
  uint uVar33;
  int iVar34;
  size_t mask;
  ulong uVar35;
  ulong uVar36;
  undefined4 uVar37;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar38;
  NodeRef root;
  NodeRef *pNVar39;
  bool bVar40;
  float fVar41;
  vint4 ai;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar51;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  undefined1 in_ZMM0 [64];
  float fVar52;
  float fVar53;
  float fVar59;
  float fVar61;
  vint4 bi_11;
  undefined1 auVar54 [16];
  float fVar63;
  undefined1 auVar55 [16];
  float fVar60;
  float fVar62;
  float fVar64;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  float fVar65;
  float fVar73;
  float fVar74;
  vint4 ai_2;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar75;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  vint4 bi_3;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  vint4 bi;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  vint4 bi_1;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  float fVar102;
  vint4 bi_2;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  vint4 bi_12;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  vfloat4 a0;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float fVar116;
  float fVar117;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar118;
  float fVar119;
  float fVar122;
  float fVar123;
  vint4 ai_1;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar124;
  float fVar125;
  float fVar127;
  float fVar128;
  vint4 ai_3;
  undefined1 auVar126 [16];
  float fVar129;
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar131 [64];
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined1 local_1938 [8];
  float fStack_1930;
  float fStack_192c;
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_true> tray;
  undefined8 local_1808;
  undefined8 uStack_1800;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar17 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar72 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar48 = vpcmpeqd_avx(auVar72,(undefined1  [16])valid_i->field_0);
    auVar72 = *(undefined1 (*) [16])(ray + 0x80);
    auVar54 = ZEXT816(0) << 0x40;
    auVar57 = vcmpps_avx(auVar72,auVar54,5);
    auVar57 = vandps_avx(auVar57,auVar48);
    uVar32 = vmovmskps_avx(auVar57);
    if (uVar32 != 0) {
      uVar35 = (ulong)(uVar32 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar91._0_4_ =
           tray.dir.field_0._0_4_ * tray.dir.field_0._0_4_ +
           tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_ +
           tray.dir.field_0._16_4_ * tray.dir.field_0._16_4_;
      auVar91._4_4_ =
           tray.dir.field_0._4_4_ * tray.dir.field_0._4_4_ +
           tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_ +
           tray.dir.field_0._20_4_ * tray.dir.field_0._20_4_;
      auVar91._8_4_ =
           tray.dir.field_0._8_4_ * tray.dir.field_0._8_4_ +
           tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_ +
           tray.dir.field_0._24_4_ * tray.dir.field_0._24_4_;
      auVar91._12_4_ =
           tray.dir.field_0._12_4_ * tray.dir.field_0._12_4_ +
           tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_ +
           tray.dir.field_0._28_4_ * tray.dir.field_0._28_4_;
      auVar48 = vrsqrtps_avx(auVar91);
      fVar96 = auVar48._0_4_;
      fVar102 = auVar48._4_4_;
      fVar52 = auVar48._8_4_;
      fVar59 = auVar48._12_4_;
      pre.depth_scale.field_0.v[0] = fVar96 * 1.5 + fVar96 * fVar96 * fVar96 * auVar91._0_4_ * -0.5;
      pre.depth_scale.field_0.v[1] =
           fVar102 * 1.5 + fVar102 * fVar102 * fVar102 * auVar91._4_4_ * -0.5;
      pre.depth_scale.field_0.v[2] = fVar52 * 1.5 + fVar52 * fVar52 * fVar52 * auVar91._8_4_ * -0.5;
      pre.depth_scale.field_0.v[3] = fVar59 * 1.5 + fVar59 * fVar59 * fVar59 * auVar91._12_4_ * -0.5
      ;
      auVar48._8_4_ = 0x80000000;
      auVar48._0_8_ = 0x8000000080000000;
      auVar48._12_4_ = 0x80000000;
      do {
        lVar16 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
          }
        }
        auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar16 * 4 + 0x40)),
                                ZEXT416(*(uint *)(ray + lVar16 * 4 + 0x50)),0x1c);
        auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + lVar16 * 4 + 0x60)),0x28);
        fVar96 = *(float *)((long)pre.ray_space + lVar16 * 4 + -0x10);
        auVar109._0_4_ = auVar91._0_4_ * fVar96;
        auVar109._4_4_ = auVar91._4_4_ * fVar96;
        auVar109._8_4_ = auVar91._8_4_ * fVar96;
        auVar109._12_4_ = auVar91._12_4_ * fVar96;
        auVar106 = vshufpd_avx(auVar109,auVar109,1);
        auVar91 = vmovshdup_avx(auVar109);
        auVar113._0_4_ = auVar91._0_4_ ^ 0x80000000;
        auVar91 = vunpckhps_avx(auVar109,auVar54);
        auVar113._4_12_ = ZEXT812(0) << 0x20;
        auVar111 = vshufps_avx(auVar91,auVar113,0x41);
        auVar110._0_8_ = auVar106._0_8_ ^ 0x8000000080000000;
        auVar110._8_8_ = auVar106._8_8_ ^ auVar48._8_8_;
        auVar110 = vinsertps_avx(auVar110,auVar109,0x2a);
        auVar91 = vdpps_avx(auVar111,auVar111,0x7f);
        auVar106 = vdpps_avx(auVar110,auVar110,0x7f);
        auVar91 = vcmpps_avx(auVar106,auVar91,1);
        auVar91 = vshufps_avx(auVar91,auVar91,0);
        auVar91 = vblendvps_avx(auVar110,auVar111,auVar91);
        auVar106 = vdpps_avx(auVar91,auVar91,0x7f);
        auVar110 = vrsqrtss_avx(auVar106,auVar106);
        fVar102 = auVar110._0_4_;
        auVar106 = ZEXT416((uint)(fVar102 * 1.5 - auVar106._0_4_ * 0.5 * fVar102 * fVar102 * fVar102
                                 ));
        auVar106 = vshufps_avx(auVar106,auVar106,0);
        auVar111._0_4_ = auVar91._0_4_ * auVar106._0_4_;
        auVar111._4_4_ = auVar91._4_4_ * auVar106._4_4_;
        auVar111._8_4_ = auVar91._8_4_ * auVar106._8_4_;
        auVar111._12_4_ = auVar91._12_4_ * auVar106._12_4_;
        auVar91 = vshufps_avx(auVar111,auVar111,0xc9);
        auVar106 = vshufps_avx(auVar109,auVar109,0xc9);
        auVar120._0_4_ = auVar106._0_4_ * auVar111._0_4_;
        auVar120._4_4_ = auVar106._4_4_ * auVar111._4_4_;
        auVar120._8_4_ = auVar106._8_4_ * auVar111._8_4_;
        auVar120._12_4_ = auVar106._12_4_ * auVar111._12_4_;
        auVar114._0_4_ = auVar109._0_4_ * auVar91._0_4_;
        auVar114._4_4_ = auVar109._4_4_ * auVar91._4_4_;
        auVar114._8_4_ = auVar109._8_4_ * auVar91._8_4_;
        auVar114._12_4_ = auVar109._12_4_ * auVar91._12_4_;
        auVar91 = vsubps_avx(auVar114,auVar120);
        auVar110 = vshufps_avx(auVar91,auVar91,0xc9);
        auVar91 = vdpps_avx(auVar110,auVar110,0x7f);
        auVar106 = vrsqrtss_avx(auVar91,auVar91);
        fVar102 = auVar106._0_4_;
        auVar91 = ZEXT416((uint)(fVar102 * 1.5 - auVar91._0_4_ * 0.5 * fVar102 * fVar102 * fVar102))
        ;
        auVar91 = vshufps_avx(auVar91,auVar91,0);
        auVar115._0_4_ = auVar91._0_4_ * auVar110._0_4_;
        auVar115._4_4_ = auVar91._4_4_ * auVar110._4_4_;
        auVar115._8_4_ = auVar91._8_4_ * auVar110._8_4_;
        auVar115._12_4_ = auVar91._12_4_ * auVar110._12_4_;
        auVar106._0_4_ = fVar96 * auVar109._0_4_;
        auVar106._4_4_ = fVar96 * auVar109._4_4_;
        auVar106._8_4_ = fVar96 * auVar109._8_4_;
        auVar106._12_4_ = fVar96 * auVar109._12_4_;
        auVar110 = vunpcklps_avx(auVar111,auVar106);
        auVar91 = vunpckhps_avx(auVar111,auVar106);
        auVar111 = vunpcklps_avx(auVar115,auVar54);
        auVar106 = vunpckhps_avx(auVar115,auVar54);
        aVar19 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar91,auVar106);
        aVar20 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar110,auVar111);
        aVar18 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar110,auVar111);
        pre.ray_space[lVar16].vx.field_0 = aVar20;
        pre.ray_space[lVar16].vy.field_0 = aVar18;
        pre.ray_space[lVar16].vz.field_0 = aVar19;
        uVar35 = uVar35 & uVar35 - 1;
      } while (uVar35 != 0);
      tray.org.field_0._0_4_ = (undefined4)*(undefined8 *)ray;
      tray.org.field_0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      tray.org.field_0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      tray.org.field_0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_4_ = (undefined4)*(undefined8 *)(ray + 0x20);
      tray.org.field_0._36_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x20) >> 0x20);
      tray.org.field_0._40_4_ = (undefined4)*(undefined8 *)(ray + 0x28);
      tray.org.field_0._44_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x28) >> 0x20);
      auVar97._8_4_ = 0x7fffffff;
      auVar97._0_8_ = 0x7fffffff7fffffff;
      auVar97._12_4_ = 0x7fffffff;
      auVar48 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar97);
      auVar103._8_4_ = 0x219392ef;
      auVar103._0_8_ = 0x219392ef219392ef;
      auVar103._12_4_ = 0x219392ef;
      auVar54 = vcmpps_avx(auVar48,auVar103,1);
      auVar107._8_4_ = 0x3f800000;
      auVar107._0_8_ = &DAT_3f8000003f800000;
      auVar107._12_4_ = 0x3f800000;
      auVar106 = vdivps_avx(auVar107,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar48 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar97);
      auVar91 = vcmpps_avx(auVar48,auVar103,1);
      auVar110 = vdivps_avx(auVar107,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar48 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar97);
      auVar48 = vcmpps_avx(auVar48,auVar103,1);
      auVar111 = vdivps_avx(auVar107,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar104._8_4_ = 0x5d5e0b6b;
      auVar104._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar104._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar106,auVar104,auVar54)
      ;
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar110,auVar104,auVar91)
      ;
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar111,auVar104,auVar48)
      ;
      auVar54 = ZEXT816(0) << 0x20;
      auVar48 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar54,1);
      auVar84._8_4_ = 0x10;
      auVar84._0_8_ = 0x1000000010;
      auVar84._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar48,auVar84);
      auVar48 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar54,5);
      auVar85._8_4_ = 0x20;
      auVar85._0_8_ = 0x2000000020;
      auVar85._12_4_ = 0x20;
      auVar92._8_4_ = 0x30;
      auVar92._0_8_ = 0x3000000030;
      auVar92._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar92,auVar85,auVar48);
      auVar48 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar54,5);
      auVar66._8_4_ = 0x40;
      auVar66._0_8_ = 0x4000000040;
      auVar66._12_4_ = 0x40;
      auVar76._8_4_ = 0x50;
      auVar76._0_8_ = 0x5000000050;
      auVar76._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar76,auVar66,auVar48);
      auVar48 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar54);
      auVar72 = vmaxps_avx(auVar72,auVar54);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar131 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar48,auVar57);
      auVar54._8_4_ = 0xff800000;
      auVar54._0_8_ = 0xff800000ff800000;
      auVar54._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar54,auVar72,auVar57);
      auVar72 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0._0_4_ = auVar57._0_4_ ^ auVar72._0_4_;
      terminated.field_0._4_4_ = auVar57._4_4_ ^ auVar72._4_4_;
      terminated.field_0._8_4_ = auVar57._8_4_ ^ auVar72._8_4_;
      terminated.field_0._12_4_ = auVar57._12_4_ ^ auVar72._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar32 = 3;
      }
      else {
        uVar32 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar39 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar38 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      do {
        paVar38 = &((vfloat<4> *)paVar38)[-1].field_0;
        root.ptr = pNVar39[-1].ptr;
        pNVar39 = pNVar39 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0032ece4:
          iVar34 = 3;
        }
        else {
          aVar12.v = *(__m128 *)paVar38;
          auVar72 = vcmpps_avx((undefined1  [16])aVar12,(undefined1  [16])tray.tfar.field_0,1);
          uVar33 = vmovmskps_avx(auVar72);
          if (uVar33 == 0) {
            iVar34 = 2;
          }
          else {
            uVar35 = (ulong)(uVar33 & 0xff);
            uVar33 = POPCOUNT(uVar33 & 0xff);
            iVar34 = 0;
            if (uVar33 <= uVar32) {
              do {
                sVar14 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> sVar14 & 1) == 0; sVar14 = sVar14 + 1) {
                  }
                }
                bVar40 = occluded1(This,bvh,root,sVar14,&pre,ray,&tray,context);
                if (bVar40) {
                  terminated.field_0.i[sVar14] = -1;
                }
                uVar35 = uVar35 & uVar35 - 1;
              } while (uVar35 != 0);
              auVar72 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
              iVar34 = 3;
              auVar131 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar72[0xf] < '\0') {
                auVar72._8_4_ = 0xff800000;
                auVar72._0_8_ = 0xff800000ff800000;
                auVar72._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar72,
                                   (undefined1  [16])terminated.field_0);
                iVar34 = 2;
              }
            }
            vVar30.field_0 = terminated.field_0;
            auVar58 = ZEXT1664((undefined1  [16])aVar12);
            if (uVar32 < uVar33) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr != 0xfffffffffffffff8) {
                    auVar72 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar58._0_16_,6);
                    if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar72 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar72 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar72[0xf]) {
                      iVar34 = 2;
                    }
                    else {
                      bVar13 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      pvVar15 = This->leafIntersector;
                      local_1808 = auVar17._0_8_;
                      uStack_1800 = auVar17._8_8_;
                      valid_o.field_0._0_8_ = local_1808;
                      valid_o.field_0._8_8_ = uStack_1800;
                      uVar33 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                      if ((uVar33 ^ 0xf) != 0) {
                        uVar35 = (ulong)(byte)(uVar33 ^ 0xf);
                        do {
                          lVar16 = 0;
                          if (uVar35 != 0) {
                            for (; (uVar35 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                            }
                          }
                          cVar31 = (**(code **)((long)pvVar15 + (ulong)bVar13 * 0x40 + 0x18))
                                             (&pre,ray,lVar16,context,
                                              (byte *)(root.ptr & 0xfffffffffffffff0));
                          if (cVar31 != '\0') {
                            valid_o.field_0.i[lVar16] = -1;
                          }
                          uVar35 = uVar35 & uVar35 - 1;
                        } while (uVar35 != 0);
                      }
                      auVar22._8_8_ = valid_o.field_0._8_8_;
                      auVar22._0_8_ = valid_o.field_0._0_8_;
                      terminated.field_0 =
                           (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                           vorps_avx((undefined1  [16])vVar30.field_0,auVar22);
                      auVar72 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
                      if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar72 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar72 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar72[0xf]) {
                        iVar34 = 3;
                      }
                      else {
                        auVar71._8_4_ = 0xff800000;
                        auVar71._0_8_ = 0xff800000ff800000;
                        auVar71._12_4_ = 0xff800000;
                        tray.tfar.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar71,
                                           (undefined1  [16])terminated.field_0);
                        iVar34 = 0;
                      }
                    }
                    auVar131 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                 ));
                    break;
                  }
                  goto LAB_0032ece4;
                }
                uVar36 = root.ptr & 0xfffffffffffffff0;
                uVar33 = (uint)root.ptr & 7;
                auVar72 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar58._0_16_,6);
                auVar58 = ZEXT1664(auVar131._0_16_);
                uVar35 = 0;
                root.ptr = 8;
                do {
                  sVar14 = *(size_t *)(uVar36 + uVar35 * 8);
                  if (sVar14 != 8) {
                    if ((uVar33 == 6) || (uVar33 == 1)) {
                      fVar96 = *(float *)(uVar36 + 0x80 + uVar35 * 4);
                      fVar102 = *(float *)(uVar36 + 0x20 + uVar35 * 4);
                      auVar48 = *(undefined1 (*) [16])(ray + 0x70);
                      fVar52 = auVar48._0_4_;
                      fVar59 = auVar48._4_4_;
                      fVar61 = auVar48._8_4_;
                      fVar63 = auVar48._12_4_;
                      auVar42._0_4_ = fVar52 * fVar96 + fVar102;
                      auVar42._4_4_ = fVar59 * fVar96 + fVar102;
                      auVar42._8_4_ = fVar61 * fVar96 + fVar102;
                      auVar42._12_4_ = fVar63 * fVar96 + fVar102;
                      fVar96 = *(float *)(uVar36 + 0xa0 + uVar35 * 4);
                      fVar102 = *(float *)(uVar36 + 0x40 + uVar35 * 4);
                      auVar67._0_4_ = fVar52 * fVar96 + fVar102;
                      auVar67._4_4_ = fVar59 * fVar96 + fVar102;
                      auVar67._8_4_ = fVar61 * fVar96 + fVar102;
                      auVar67._12_4_ = fVar63 * fVar96 + fVar102;
                      fVar96 = *(float *)(uVar36 + 0xc0 + uVar35 * 4);
                      fVar102 = *(float *)(uVar36 + 0x60 + uVar35 * 4);
                      auVar77._0_4_ = fVar52 * fVar96 + fVar102;
                      auVar77._4_4_ = fVar59 * fVar96 + fVar102;
                      auVar77._8_4_ = fVar61 * fVar96 + fVar102;
                      auVar77._12_4_ = fVar63 * fVar96 + fVar102;
                      fVar96 = *(float *)(uVar36 + 0x90 + uVar35 * 4);
                      fVar102 = *(float *)(uVar36 + 0x30 + uVar35 * 4);
                      auVar86._0_4_ = fVar52 * fVar96 + fVar102;
                      auVar86._4_4_ = fVar59 * fVar96 + fVar102;
                      auVar86._8_4_ = fVar61 * fVar96 + fVar102;
                      auVar86._12_4_ = fVar63 * fVar96 + fVar102;
                      fVar96 = *(float *)(uVar36 + 0xb0 + uVar35 * 4);
                      fVar102 = *(float *)(uVar36 + 0x50 + uVar35 * 4);
                      auVar93._0_4_ = fVar52 * fVar96 + fVar102;
                      auVar93._4_4_ = fVar59 * fVar96 + fVar102;
                      auVar93._8_4_ = fVar61 * fVar96 + fVar102;
                      auVar93._12_4_ = fVar63 * fVar96 + fVar102;
                      fVar96 = *(float *)(uVar36 + 0xd0 + uVar35 * 4);
                      fVar102 = *(float *)(uVar36 + 0x70 + uVar35 * 4);
                      auVar98._0_4_ = fVar52 * fVar96 + fVar102;
                      auVar98._4_4_ = fVar59 * fVar96 + fVar102;
                      auVar98._8_4_ = fVar61 * fVar96 + fVar102;
                      auVar98._12_4_ = fVar63 * fVar96 + fVar102;
                      auVar23._4_4_ = tray.org.field_0._4_4_;
                      auVar23._0_4_ = tray.org.field_0._0_4_;
                      auVar23._8_4_ = tray.org.field_0._8_4_;
                      auVar23._12_4_ = tray.org.field_0._12_4_;
                      auVar24._8_8_ = tray.org.field_0._24_8_;
                      auVar24._0_8_ = tray.org.field_0._16_8_;
                      auVar25._4_4_ = tray.org.field_0._36_4_;
                      auVar25._0_4_ = tray.org.field_0._32_4_;
                      auVar25._8_4_ = tray.org.field_0._40_4_;
                      auVar25._12_4_ = tray.org.field_0._44_4_;
                      auVar54 = vsubps_avx(auVar42,auVar23);
                      auVar43._0_4_ = tray.rdir.field_0._0_4_ * auVar54._0_4_;
                      auVar43._4_4_ = tray.rdir.field_0._4_4_ * auVar54._4_4_;
                      auVar43._8_4_ = tray.rdir.field_0._8_4_ * auVar54._8_4_;
                      auVar43._12_4_ = tray.rdir.field_0._12_4_ * auVar54._12_4_;
                      auVar54 = vsubps_avx(auVar67,auVar24);
                      auVar121._0_4_ = tray.rdir.field_0._16_4_ * auVar54._0_4_;
                      auVar121._4_4_ = tray.rdir.field_0._20_4_ * auVar54._4_4_;
                      auVar121._8_4_ = tray.rdir.field_0._24_4_ * auVar54._8_4_;
                      auVar121._12_4_ = tray.rdir.field_0._28_4_ * auVar54._12_4_;
                      auVar54 = vsubps_avx(auVar77,auVar25);
                      auVar126._0_4_ = auVar54._0_4_ * (float)tray.rdir.field_0._32_4_;
                      auVar126._4_4_ = auVar54._4_4_ * (float)tray.rdir.field_0._36_4_;
                      auVar126._8_4_ = auVar54._8_4_ * (float)tray.rdir.field_0._40_4_;
                      auVar126._12_4_ = auVar54._12_4_ * (float)tray.rdir.field_0._44_4_;
                      auVar54 = vsubps_avx(auVar86,auVar23);
                      auVar87._0_4_ = tray.rdir.field_0._0_4_ * auVar54._0_4_;
                      auVar87._4_4_ = tray.rdir.field_0._4_4_ * auVar54._4_4_;
                      auVar87._8_4_ = tray.rdir.field_0._8_4_ * auVar54._8_4_;
                      auVar87._12_4_ = tray.rdir.field_0._12_4_ * auVar54._12_4_;
                      auVar54 = vsubps_avx(auVar93,auVar24);
                      auVar94._0_4_ = tray.rdir.field_0._16_4_ * auVar54._0_4_;
                      auVar94._4_4_ = tray.rdir.field_0._20_4_ * auVar54._4_4_;
                      auVar94._8_4_ = tray.rdir.field_0._24_4_ * auVar54._8_4_;
                      auVar94._12_4_ = tray.rdir.field_0._28_4_ * auVar54._12_4_;
                      auVar54 = vsubps_avx(auVar98,auVar25);
                      auVar78._0_4_ = auVar54._0_4_ * (float)tray.rdir.field_0._32_4_;
                      auVar78._4_4_ = auVar54._4_4_ * (float)tray.rdir.field_0._36_4_;
                      auVar78._8_4_ = auVar54._8_4_ * (float)tray.rdir.field_0._40_4_;
                      auVar78._12_4_ = auVar54._12_4_ * (float)tray.rdir.field_0._44_4_;
                      auVar54 = vpminsd_avx(auVar43,auVar87);
                      auVar91 = vpminsd_avx(auVar121,auVar94);
                      auVar54 = vpmaxsd_avx(auVar54,auVar91);
                      auVar91 = vpminsd_avx(auVar126,auVar78);
                      auVar54 = vpmaxsd_avx(auVar54,auVar91);
                      auVar68._0_4_ = auVar54._0_4_ * 0.99999964;
                      auVar68._4_4_ = auVar54._4_4_ * 0.99999964;
                      auVar68._8_4_ = auVar54._8_4_ * 0.99999964;
                      auVar68._12_4_ = auVar54._12_4_ * 0.99999964;
                      auVar54 = vpmaxsd_avx(auVar43,auVar87);
                      auVar91 = vpmaxsd_avx(auVar121,auVar94);
                      auVar91 = vpminsd_avx(auVar54,auVar91);
                      auVar54 = vpmaxsd_avx(auVar126,auVar78);
                      auVar91 = vpminsd_avx(auVar91,auVar54);
                      auVar54 = vpmaxsd_avx(auVar68,(undefined1  [16])tray.tnear.field_0);
                      auVar79._0_4_ = auVar91._0_4_ * 1.0000004;
                      auVar79._4_4_ = auVar91._4_4_ * 1.0000004;
                      auVar79._8_4_ = auVar91._8_4_ * 1.0000004;
                      auVar79._12_4_ = auVar91._12_4_ * 1.0000004;
                      auVar91 = vpminsd_avx(auVar79,(undefined1  [16])tray.tfar.field_0);
                      auVar54 = vcmpps_avx(auVar54,auVar91,2);
                      if (uVar33 == 6) {
                        uVar37 = *(undefined4 *)(uVar36 + 0xe0 + uVar35 * 4);
                        auVar80._4_4_ = uVar37;
                        auVar80._0_4_ = uVar37;
                        auVar80._8_4_ = uVar37;
                        auVar80._12_4_ = uVar37;
                        auVar91 = vcmpps_avx(auVar80,auVar48,2);
                        uVar37 = *(undefined4 *)(uVar36 + 0xf0 + uVar35 * 4);
                        auVar88._4_4_ = uVar37;
                        auVar88._0_4_ = uVar37;
                        auVar88._8_4_ = uVar37;
                        auVar88._12_4_ = uVar37;
                        auVar48 = vcmpps_avx(auVar48,auVar88,1);
                        auVar48 = vandps_avx(auVar91,auVar48);
                        auVar54 = vandps_avx(auVar48,auVar54);
                      }
                    }
                    else {
                      fVar96 = *(float *)(uVar36 + 0x50 + uVar35 * 4);
                      fVar102 = *(float *)(uVar36 + 0x60 + uVar35 * 4);
                      fVar52 = *(float *)(uVar36 + 0x70 + uVar35 * 4);
                      fVar59 = *(float *)(uVar36 + 0x80 + uVar35 * 4);
                      fVar61 = *(float *)(uVar36 + 0x90 + uVar35 * 4);
                      fVar63 = *(float *)(uVar36 + 0xe0 + uVar35 * 4);
                      fVar1 = *(float *)(uVar36 + 0xf0 + uVar35 * 4);
                      fVar2 = *(float *)(uVar36 + 0x100 + uVar35 * 4);
                      fVar3 = *(float *)(uVar36 + 0x110 + uVar35 * 4);
                      fVar4 = *(float *)(uVar36 + 0x120 + uVar35 * 4);
                      fVar5 = *(float *)(uVar36 + 0x130 + uVar35 * 4);
                      auVar48 = *(undefined1 (*) [16])(ray + 0x70);
                      auVar81._8_4_ = 0x3f800000;
                      auVar81._0_8_ = &DAT_3f8000003f800000;
                      auVar81._12_4_ = 0x3f800000;
                      auVar54 = vsubps_avx(auVar81,auVar48);
                      fVar119 = auVar48._0_4_;
                      fVar122 = auVar48._4_4_;
                      fVar123 = auVar48._8_4_;
                      fVar124 = auVar48._12_4_;
                      fVar125 = auVar54._0_4_;
                      fVar130 = fVar125 * 0.0;
                      fVar127 = auVar54._4_4_;
                      fVar132 = fVar127 * 0.0;
                      fVar128 = auVar54._8_4_;
                      fVar133 = fVar128 * 0.0;
                      fVar129 = auVar54._12_4_;
                      fVar134 = fVar129 * 0.0;
                      local_1938._4_4_ = fVar132 + fVar122 * fVar1;
                      local_1938._0_4_ = fVar130 + fVar119 * fVar1;
                      fStack_1930 = fVar133 + fVar123 * fVar1;
                      fStack_192c = fVar134 + fVar124 * fVar1;
                      fVar1 = *(float *)(uVar36 + 0xa0 + uVar35 * 4);
                      fVar6 = *(float *)(uVar36 + 0x20 + uVar35 * 4);
                      auVar69._0_4_ =
                           fVar6 * (float)tray.dir.field_0._0_4_ +
                           fVar96 * (float)tray.dir.field_0._16_4_ +
                           fVar59 * (float)tray.dir.field_0._32_4_;
                      auVar69._4_4_ =
                           fVar6 * (float)tray.dir.field_0._4_4_ +
                           fVar96 * (float)tray.dir.field_0._20_4_ +
                           fVar59 * (float)tray.dir.field_0._36_4_;
                      auVar69._8_4_ =
                           fVar6 * (float)tray.dir.field_0._8_4_ +
                           fVar96 * (float)tray.dir.field_0._24_4_ +
                           fVar59 * (float)tray.dir.field_0._40_4_;
                      auVar69._12_4_ =
                           fVar6 * (float)tray.dir.field_0._12_4_ +
                           fVar96 * (float)tray.dir.field_0._28_4_ +
                           fVar59 * (float)tray.dir.field_0._44_4_;
                      fVar7 = *(float *)(uVar36 + 0x30 + uVar35 * 4);
                      auVar99._0_4_ =
                           fVar102 * (float)tray.dir.field_0._16_4_ +
                           fVar61 * (float)tray.dir.field_0._32_4_ +
                           fVar7 * (float)tray.dir.field_0._0_4_;
                      auVar99._4_4_ =
                           fVar102 * (float)tray.dir.field_0._20_4_ +
                           fVar61 * (float)tray.dir.field_0._36_4_ +
                           fVar7 * (float)tray.dir.field_0._4_4_;
                      auVar99._8_4_ =
                           fVar102 * (float)tray.dir.field_0._24_4_ +
                           fVar61 * (float)tray.dir.field_0._40_4_ +
                           fVar7 * (float)tray.dir.field_0._8_4_;
                      auVar99._12_4_ =
                           fVar102 * (float)tray.dir.field_0._28_4_ +
                           fVar61 * (float)tray.dir.field_0._44_4_ +
                           fVar7 * (float)tray.dir.field_0._12_4_;
                      fVar8 = *(float *)(uVar36 + 0x40 + uVar35 * 4);
                      auVar44._0_4_ =
                           fVar8 * (float)tray.dir.field_0._0_4_ +
                           fVar52 * (float)tray.dir.field_0._16_4_ +
                           fVar1 * (float)tray.dir.field_0._32_4_;
                      auVar44._4_4_ =
                           fVar8 * (float)tray.dir.field_0._4_4_ +
                           fVar52 * (float)tray.dir.field_0._20_4_ +
                           fVar1 * (float)tray.dir.field_0._36_4_;
                      auVar44._8_4_ =
                           fVar8 * (float)tray.dir.field_0._8_4_ +
                           fVar52 * (float)tray.dir.field_0._24_4_ +
                           fVar1 * (float)tray.dir.field_0._40_4_;
                      auVar44._12_4_ =
                           fVar8 * (float)tray.dir.field_0._12_4_ +
                           fVar52 * (float)tray.dir.field_0._28_4_ +
                           fVar1 * (float)tray.dir.field_0._44_4_;
                      auVar105._8_4_ = 0x7fffffff;
                      auVar105._0_8_ = 0x7fffffff7fffffff;
                      auVar105._12_4_ = 0x7fffffff;
                      auVar48 = vandps_avx(auVar69,auVar105);
                      auVar108._8_4_ = 0x219392ef;
                      auVar108._0_8_ = 0x219392ef219392ef;
                      auVar108._12_4_ = 0x219392ef;
                      auVar48 = vcmpps_avx(auVar48,auVar108,1);
                      auVar54 = vblendvps_avx(auVar69,auVar108,auVar48);
                      auVar48 = vandps_avx(auVar99,auVar105);
                      auVar48 = vcmpps_avx(auVar48,auVar108,1);
                      auVar91 = vblendvps_avx(auVar99,auVar108,auVar48);
                      auVar48 = vandps_avx(auVar44,auVar105);
                      auVar48 = vcmpps_avx(auVar48,auVar108,1);
                      auVar48 = vblendvps_avx(auVar44,auVar108,auVar48);
                      auVar106 = vrcpps_avx(auVar54);
                      fVar65 = auVar106._0_4_;
                      auVar55._0_4_ = fVar65 * auVar54._0_4_;
                      fVar73 = auVar106._4_4_;
                      auVar55._4_4_ = fVar73 * auVar54._4_4_;
                      fVar74 = auVar106._8_4_;
                      auVar55._8_4_ = fVar74 * auVar54._8_4_;
                      fVar75 = auVar106._12_4_;
                      auVar55._12_4_ = fVar75 * auVar54._12_4_;
                      auVar54 = vsubps_avx(auVar81,auVar55);
                      fVar65 = fVar65 + fVar65 * auVar54._0_4_;
                      fVar73 = fVar73 + fVar73 * auVar54._4_4_;
                      fVar74 = fVar74 + fVar74 * auVar54._8_4_;
                      fVar75 = fVar75 + fVar75 * auVar54._12_4_;
                      auVar54 = vrcpps_avx(auVar91);
                      fVar53 = auVar54._0_4_;
                      auVar100._0_4_ = fVar53 * auVar91._0_4_;
                      fVar60 = auVar54._4_4_;
                      auVar100._4_4_ = fVar60 * auVar91._4_4_;
                      fVar62 = auVar54._8_4_;
                      auVar100._8_4_ = fVar62 * auVar91._8_4_;
                      fVar64 = auVar54._12_4_;
                      auVar100._12_4_ = fVar64 * auVar91._12_4_;
                      auVar54 = vsubps_avx(auVar81,auVar100);
                      fVar53 = fVar53 + fVar53 * auVar54._0_4_;
                      fVar60 = fVar60 + fVar60 * auVar54._4_4_;
                      fVar62 = fVar62 + fVar62 * auVar54._8_4_;
                      fVar64 = fVar64 + fVar64 * auVar54._12_4_;
                      auVar54 = vrcpps_avx(auVar48);
                      fVar41 = auVar54._0_4_;
                      auVar45._0_4_ = fVar41 * auVar48._0_4_;
                      fVar49 = auVar54._4_4_;
                      auVar45._4_4_ = fVar49 * auVar48._4_4_;
                      fVar50 = auVar54._8_4_;
                      auVar45._8_4_ = fVar50 * auVar48._8_4_;
                      fVar51 = auVar54._12_4_;
                      auVar45._12_4_ = fVar51 * auVar48._12_4_;
                      auVar48 = vsubps_avx(auVar81,auVar45);
                      fVar41 = fVar41 + fVar41 * auVar48._0_4_;
                      fVar49 = fVar49 + fVar49 * auVar48._4_4_;
                      fVar50 = fVar50 + fVar50 * auVar48._8_4_;
                      fVar51 = fVar51 + fVar51 * auVar48._12_4_;
                      fVar9 = *(float *)(uVar36 + 0xb0 + uVar35 * 4);
                      fVar10 = *(float *)(uVar36 + 0xc0 + uVar35 * 4);
                      fVar11 = *(float *)(uVar36 + 0xd0 + uVar35 * 4);
                      fVar112 = (float)tray.org.field_0._16_8_;
                      fVar116 = (float)((ulong)tray.org.field_0._16_8_ >> 0x20);
                      fVar117 = (float)tray.org.field_0._24_8_;
                      fVar118 = (float)((ulong)tray.org.field_0._24_8_ >> 0x20);
                      auVar89._0_4_ =
                           fVar6 * (float)tray.org.field_0._0_4_ +
                           fVar112 * fVar96 + fVar59 * (float)tray.org.field_0._32_4_ + fVar9;
                      auVar89._4_4_ =
                           fVar6 * (float)tray.org.field_0._4_4_ +
                           fVar116 * fVar96 + fVar59 * (float)tray.org.field_0._36_4_ + fVar9;
                      auVar89._8_4_ =
                           fVar6 * (float)tray.org.field_0._8_4_ +
                           fVar117 * fVar96 + fVar59 * (float)tray.org.field_0._40_4_ + fVar9;
                      auVar89._12_4_ =
                           fVar6 * (float)tray.org.field_0._12_4_ +
                           fVar118 * fVar96 + fVar59 * (float)tray.org.field_0._44_4_ + fVar9;
                      auVar82._0_4_ =
                           fVar7 * (float)tray.org.field_0._0_4_ +
                           fVar10 + fVar61 * (float)tray.org.field_0._32_4_ + fVar102 * fVar112;
                      auVar82._4_4_ =
                           fVar7 * (float)tray.org.field_0._4_4_ +
                           fVar10 + fVar61 * (float)tray.org.field_0._36_4_ + fVar102 * fVar116;
                      auVar82._8_4_ =
                           fVar7 * (float)tray.org.field_0._8_4_ +
                           fVar10 + fVar61 * (float)tray.org.field_0._40_4_ + fVar102 * fVar117;
                      auVar82._12_4_ =
                           fVar7 * (float)tray.org.field_0._12_4_ +
                           fVar10 + fVar61 * (float)tray.org.field_0._44_4_ + fVar102 * fVar118;
                      auVar131 = ZEXT1664(CONCAT412(0x7f800000,
                                                    CONCAT48(0x7f800000,0x7f8000007f800000)));
                      auVar95._0_4_ =
                           fVar8 * (float)tray.org.field_0._0_4_ +
                           fVar112 * fVar52 + fVar11 + fVar1 * (float)tray.org.field_0._32_4_;
                      auVar95._4_4_ =
                           fVar8 * (float)tray.org.field_0._4_4_ +
                           fVar116 * fVar52 + fVar11 + fVar1 * (float)tray.org.field_0._36_4_;
                      auVar95._8_4_ =
                           fVar8 * (float)tray.org.field_0._8_4_ +
                           fVar117 * fVar52 + fVar11 + fVar1 * (float)tray.org.field_0._40_4_;
                      auVar95._12_4_ =
                           fVar8 * (float)tray.org.field_0._12_4_ +
                           fVar118 * fVar52 + fVar11 + fVar1 * (float)tray.org.field_0._44_4_;
                      auVar27._4_4_ = fVar132 + fVar122 * fVar63;
                      auVar27._0_4_ = fVar130 + fVar119 * fVar63;
                      auVar27._8_4_ = fVar133 + fVar123 * fVar63;
                      auVar27._12_4_ = fVar134 + fVar124 * fVar63;
                      auVar48 = vsubps_avx(auVar27,auVar89);
                      auVar26._4_4_ = fVar127 + fVar122 * fVar3;
                      auVar26._0_4_ = fVar125 + fVar119 * fVar3;
                      auVar26._8_4_ = fVar128 + fVar123 * fVar3;
                      auVar26._12_4_ = fVar129 + fVar124 * fVar3;
                      auVar54 = vsubps_avx(auVar26,auVar89);
                      auVar101._0_4_ = fVar65 * auVar48._0_4_;
                      auVar101._4_4_ = fVar73 * auVar48._4_4_;
                      auVar101._8_4_ = fVar74 * auVar48._8_4_;
                      auVar101._12_4_ = fVar75 * auVar48._12_4_;
                      auVar70._0_4_ = fVar65 * auVar54._0_4_;
                      auVar70._4_4_ = fVar73 * auVar54._4_4_;
                      auVar70._8_4_ = fVar74 * auVar54._8_4_;
                      auVar70._12_4_ = fVar75 * auVar54._12_4_;
                      auVar48 = vsubps_avx(_local_1938,auVar82);
                      auVar28._4_4_ = fVar127 + fVar122 * fVar4;
                      auVar28._0_4_ = fVar125 + fVar119 * fVar4;
                      auVar28._8_4_ = fVar128 + fVar123 * fVar4;
                      auVar28._12_4_ = fVar129 + fVar124 * fVar4;
                      auVar54 = vsubps_avx(auVar28,auVar82);
                      auVar90._0_4_ = fVar53 * auVar48._0_4_;
                      auVar90._4_4_ = fVar60 * auVar48._4_4_;
                      auVar90._8_4_ = fVar62 * auVar48._8_4_;
                      auVar90._12_4_ = fVar64 * auVar48._12_4_;
                      auVar56._0_4_ = fVar53 * auVar54._0_4_;
                      auVar56._4_4_ = fVar60 * auVar54._4_4_;
                      auVar56._8_4_ = fVar62 * auVar54._8_4_;
                      auVar56._12_4_ = fVar64 * auVar54._12_4_;
                      auVar21._4_4_ = fVar132 + fVar122 * fVar2;
                      auVar21._0_4_ = fVar130 + fVar119 * fVar2;
                      auVar21._8_4_ = fVar133 + fVar123 * fVar2;
                      auVar21._12_4_ = fVar134 + fVar124 * fVar2;
                      auVar48 = vsubps_avx(auVar21,auVar95);
                      auVar83._0_4_ = fVar41 * auVar48._0_4_;
                      auVar83._4_4_ = fVar49 * auVar48._4_4_;
                      auVar83._8_4_ = fVar50 * auVar48._8_4_;
                      auVar83._12_4_ = fVar51 * auVar48._12_4_;
                      auVar29._4_4_ = fVar127 + fVar122 * fVar5;
                      auVar29._0_4_ = fVar125 + fVar119 * fVar5;
                      auVar29._8_4_ = fVar128 + fVar123 * fVar5;
                      auVar29._12_4_ = fVar129 + fVar124 * fVar5;
                      auVar48 = vsubps_avx(auVar29,auVar95);
                      auVar46._0_4_ = fVar41 * auVar48._0_4_;
                      auVar46._4_4_ = fVar49 * auVar48._4_4_;
                      auVar46._8_4_ = fVar50 * auVar48._8_4_;
                      auVar46._12_4_ = fVar51 * auVar48._12_4_;
                      auVar48 = vpminsd_avx(auVar101,auVar70);
                      auVar54 = vpminsd_avx(auVar90,auVar56);
                      auVar48 = vpmaxsd_avx(auVar48,auVar54);
                      auVar54 = vpminsd_avx(auVar83,auVar46);
                      auVar48 = vpmaxsd_avx(auVar48,auVar54);
                      auVar54 = vpmaxsd_avx(auVar101,auVar70);
                      auVar91 = vpmaxsd_avx(auVar90,auVar56);
                      auVar91 = vpminsd_avx(auVar54,auVar91);
                      auVar54 = vpmaxsd_avx(auVar83,auVar46);
                      auVar54 = vpminsd_avx(auVar91,auVar54);
                      auVar68._0_4_ = auVar48._0_4_ * 0.99999964;
                      auVar68._4_4_ = auVar48._4_4_ * 0.99999964;
                      auVar68._8_4_ = auVar48._8_4_ * 0.99999964;
                      auVar68._12_4_ = auVar48._12_4_ * 0.99999964;
                      auVar48 = vpmaxsd_avx(auVar68,(undefined1  [16])tray.tnear.field_0);
                      auVar47._0_4_ = auVar54._0_4_ * 1.0000004;
                      auVar47._4_4_ = auVar54._4_4_ * 1.0000004;
                      auVar47._8_4_ = auVar54._8_4_ * 1.0000004;
                      auVar47._12_4_ = auVar54._12_4_ * 1.0000004;
                      auVar54 = vpminsd_avx(auVar47,(undefined1  [16])tray.tfar.field_0);
                      auVar54 = vcmpps_avx(auVar48,auVar54,2);
                    }
                    auVar48 = vandps_avx(auVar54,auVar72);
                    auVar48 = vpslld_avx(auVar48,0x1f);
                    if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar48 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar48 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar48[0xf]) {
                      auVar58 = ZEXT1664(auVar58._0_16_);
                    }
                    else {
                      auVar48 = vblendvps_avx(auVar131._0_16_,auVar68,auVar48);
                      if (root.ptr != 8) {
                        pNVar39->ptr = root.ptr;
                        pNVar39 = pNVar39 + 1;
                        local_1948 = auVar58._0_8_;
                        uStack_1940 = auVar58._8_8_;
                        *(undefined8 *)paVar38 = local_1948;
                        *(undefined8 *)(paVar38->v + 2) = uStack_1940;
                        paVar38 = paVar38 + 1;
                      }
                      auVar58 = ZEXT1664(auVar48);
                      root.ptr = sVar14;
                    }
                  }
                } while ((sVar14 != 8) && (bVar40 = uVar35 < 3, uVar35 = uVar35 + 1, bVar40));
                iVar34 = 0;
                if (root.ptr == 8) {
LAB_0032ebac:
                  bVar40 = false;
                  iVar34 = 4;
                }
                else {
                  auVar72 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                       (undefined1  [16])auVar58._0_16_,6);
                  uVar37 = vmovmskps_avx(auVar72);
                  bVar40 = true;
                  if ((uint)POPCOUNT(uVar37) <= uVar32) {
                    pNVar39->ptr = root.ptr;
                    pNVar39 = pNVar39 + 1;
                    *paVar38 = auVar58._0_16_;
                    paVar38 = paVar38 + 1;
                    goto LAB_0032ebac;
                  }
                }
              } while (bVar40);
            }
          }
        }
      } while (iVar34 != 3);
      auVar17 = vandps_avx(auVar57,(undefined1  [16])terminated.field_0);
      auVar57._8_4_ = 0xff800000;
      auVar57._0_8_ = 0xff800000ff800000;
      auVar57._12_4_ = 0xff800000;
      auVar17 = vmaskmovps_avx(auVar17,auVar57);
      *(undefined1 (*) [16])(ray + 0x80) = auVar17;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }